

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Handler.cpp
# Opt level: O0

void __thiscall Handler::InputVirtualMachine(Handler *this)

{
  int iVar1;
  istream *piVar2;
  string *psVar3;
  long lVar4;
  char *pcVar5;
  mapped_type *pmVar6;
  long in_RDI;
  int j_1;
  int j;
  VirtualMachine *vm;
  uint16_t i;
  uint16_t memorySize;
  uint16_t cpuCore;
  string nodeNumStr;
  string memorySizeStr;
  string cpuCoreStr;
  string modelStr;
  string MStr;
  undefined6 in_stack_fffffffffffffe78;
  ushort in_stack_fffffffffffffe7e;
  VirtualMachine *in_stack_fffffffffffffe80;
  size_type in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffea0;
  short sVar7;
  undefined4 in_stack_fffffffffffffea4;
  int local_f0;
  int local_ec;
  string local_e8 [32];
  string *local_c8;
  ushort local_be;
  short local_ac;
  short local_aa;
  string local_a8 [32];
  string local_88 [32];
  string local_68 [32];
  string local_48 [32];
  string local_28 [40];
  
  std::__cxx11::string::string(local_28);
  std::__cxx11::string::string(local_48);
  std::__cxx11::string::string(local_68);
  std::__cxx11::string::string(local_88);
  std::__cxx11::string::string(local_a8);
  std::operator>>((istream *)&std::cin,local_28);
  iVar1 = std::__cxx11::stoi(&in_stack_fffffffffffffe80->model,
                             (size_t *)CONCAT26(in_stack_fffffffffffffe7e,in_stack_fffffffffffffe78)
                             ,0);
  *(short *)(in_RDI + 0x26) = (short)iVar1;
  std::vector<VirtualMachine,_std::allocator<VirtualMachine>_>::resize
            ((vector<VirtualMachine,_std::allocator<VirtualMachine>_> *)
             CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),in_stack_fffffffffffffe98
            );
  for (local_be = 0; local_be < *(ushort *)(in_RDI + 0x26); local_be = local_be + 1) {
    piVar2 = std::operator>>((istream *)&std::cin,local_48);
    piVar2 = std::operator>>(piVar2,local_68);
    piVar2 = std::operator>>(piVar2,local_88);
    std::operator>>(piVar2,local_a8);
    psVar3 = (string *)operator_new(0x28);
    *(undefined8 *)(psVar3 + 0x10) = 0;
    *(undefined8 *)(psVar3 + 0x18) = 0;
    *(undefined8 *)psVar3 = 0;
    *(undefined8 *)(psVar3 + 8) = 0;
    *(undefined8 *)(psVar3 + 0x20) = 0;
    VirtualMachine::VirtualMachine(in_stack_fffffffffffffe80);
    local_c8 = psVar3;
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)local_e8,(ulong)local_48);
    std::__cxx11::string::operator=(local_c8,local_e8);
    std::__cxx11::string::~string(local_e8);
    local_aa = 0;
    local_ec = 0;
    while( true ) {
      lVar4 = std::__cxx11::string::size();
      if (lVar4 - 1U <= (ulong)(long)local_ec) break;
      sVar7 = local_aa * 10;
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_68);
      local_aa = sVar7 + *pcVar5 + -0x30;
      local_ec = local_ec + 1;
    }
    *(short *)(local_c8 + 0x20) = local_aa;
    local_ac = 0;
    local_f0 = 0;
    while( true ) {
      lVar4 = std::__cxx11::string::size();
      if (lVar4 - 1U <= (ulong)(long)local_f0) break;
      sVar7 = local_ac * 10;
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_88);
      local_ac = sVar7 + *pcVar5 + -0x30;
      local_f0 = local_f0 + 1;
    }
    *(short *)(local_c8 + 0x22) = local_ac;
    pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_a8);
    local_c8[0x24] = (string)(*pcVar5 == '1');
    std::vector<VirtualMachine,_std::allocator<VirtualMachine>_>::operator[]
              ((vector<VirtualMachine,_std::allocator<VirtualMachine>_> *)(in_RDI + 0x48),
               (ulong)local_be);
    VirtualMachine::operator=
              (in_stack_fffffffffffffe80,
               (VirtualMachine *)CONCAT26(in_stack_fffffffffffffe7e,in_stack_fffffffffffffe78));
    in_stack_fffffffffffffe80 = (VirtualMachine *)(in_RDI + 0x90);
    in_stack_fffffffffffffe7e = local_be;
    std::vector<VirtualMachine,_std::allocator<VirtualMachine>_>::operator[]
              ((vector<VirtualMachine,_std::allocator<VirtualMachine>_> *)(in_RDI + 0x48),
               (ulong)local_be);
    pmVar6 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>_>
             ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>_>
                           *)in_stack_fffffffffffffe80,
                          (key_type *)CONCAT26(in_stack_fffffffffffffe7e,in_stack_fffffffffffffe78))
    ;
    *pmVar6 = in_stack_fffffffffffffe7e;
  }
  std::__cxx11::string::~string(local_a8);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

void Handler::InputVirtualMachine() {
    string MStr, modelStr, cpuCoreStr, memorySizeStr, nodeNumStr;
    uint16_t cpuCore;
    uint16_t memorySize;

    std::cin >> MStr;
    M = (uint16_t) std::stoi(MStr);
    virtualMachines.resize(M);

    for (uint16_t i = 0u; i < M; ++i) {
        std::cin >> modelStr >> cpuCoreStr >> memorySizeStr >> nodeNumStr;
        auto *vm = new VirtualMachine();

        vm->model = modelStr.substr(1, modelStr.size() - 2);

        cpuCore = 0u;
        for (int j = 0; j < cpuCoreStr.size() - 1; ++j) {
            cpuCore = cpuCore * 10 + (cpuCoreStr[j] - 48);
        }
        vm->cpuCore = cpuCore;

        memorySize = 0u;
        for (int j = 0; j < memorySizeStr.size() - 1; ++j) {
            memorySize = memorySize * 10 + (memorySizeStr[j] - 48);
        }
        vm->memorySize = memorySize;

        vm->nodeType = (nodeNumStr[0] == '1');
        virtualMachines[i] = *vm;
        virtualMachineMap[virtualMachines[i].model] = i;
    }
}